

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

void EccPoint_double_jacobian(uECC_word_t *X1,uECC_word_t *Y1,uECC_word_t *Z1)

{
  ulong uVar1;
  uECC_word_t uVar2;
  uECC_word_t uVar3;
  uECC_word_t uVar4;
  long lVar5;
  uECC_word_t *puVar6;
  ulong uVar7;
  uECC_word_t *puVar8;
  ulong uVar9;
  ulong uVar10;
  uECC_word_t *end;
  uECC_word_t local_b8;
  uECC_word_t product [8];
  uECC_word_t t4 [4];
  uECC_word_t t5 [4];
  
  lVar5 = 0;
  do {
    if (Z1[lVar5] != 0) {
      puVar8 = product + 7;
      vli_modSquare_fast(puVar8,Y1);
      vli_mult(&local_b8,X1,puVar8);
      vli_mmod_fast(t4 + 3,&local_b8);
      vli_modSquare_fast(puVar8,puVar8);
      vli_mult(&local_b8,Y1,Z1);
      vli_mmod_fast(Y1,&local_b8);
      vli_modSquare_fast(Z1,Z1);
      vli_modAdd(X1,X1,Z1,curve_p);
      puVar8 = curve_p;
      vli_modAdd(Z1,Z1,Z1,curve_p);
      vli_modSub(Z1,X1,Z1,puVar8);
      vli_mult(&local_b8,X1,Z1);
      vli_mmod_fast(X1,&local_b8);
      vli_modAdd(Z1,X1,X1,curve_p);
      vli_modAdd(X1,X1,Z1,curve_p);
      if ((*X1 & 1) == 0) {
        puVar6 = X1 + 4;
        puVar8 = (uECC_word_t *)0x0;
        do {
          uVar9 = puVar6[-1];
          puVar6[-1] = uVar9 >> 1 | (ulong)puVar8;
          puVar6 = puVar6 + -1;
          puVar8 = (uECC_word_t *)(uVar9 << 0x3f);
        } while (X1 < puVar6);
      }
      else {
        lVar5 = 0;
        uVar9 = 0;
        do {
          uVar1 = *(ulong *)((long)X1 + lVar5);
          uVar10 = uVar1 + uVar9 + *(long *)((long)curve_p + lVar5);
          uVar7 = (ulong)(uVar10 < uVar1);
          if (uVar10 == uVar1) {
            uVar7 = uVar9;
          }
          *(ulong *)((long)X1 + lVar5) = uVar10;
          lVar5 = lVar5 + 8;
          uVar9 = uVar7;
        } while (lVar5 != 0x20);
        puVar8 = X1 + 4;
        uVar9 = 0;
        do {
          uVar1 = puVar8[-1];
          puVar8[-1] = uVar1 >> 1 | uVar9;
          puVar8 = puVar8 + -1;
          uVar9 = uVar1 << 0x3f;
        } while (X1 < puVar8);
        X1[3] = X1[3] | uVar7 << 0x3f;
      }
      vli_modSquare_fast(Z1,X1);
      puVar6 = t4 + 3;
      vli_modSub(Z1,Z1,puVar6,puVar8);
      vli_modSub(Z1,Z1,puVar6,puVar8);
      vli_modSub(puVar6,puVar6,Z1,puVar8);
      vli_mult(&local_b8,X1,puVar6);
      vli_mmod_fast(X1,&local_b8);
      vli_modSub(product + 7,X1,product + 7,puVar8);
      uVar2 = *Z1;
      uVar3 = Z1[1];
      uVar4 = Z1[3];
      X1[2] = Z1[2];
      X1[3] = uVar4;
      *X1 = uVar2;
      X1[1] = uVar3;
      uVar2 = *Y1;
      uVar3 = Y1[1];
      uVar4 = Y1[3];
      Z1[2] = Y1[2];
      Z1[3] = uVar4;
      *Z1 = uVar2;
      Z1[1] = uVar3;
      Y1[2] = t4[1];
      Y1[3] = t4[2];
      *Y1 = product[7];
      Y1[1] = t4[0];
      return;
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

static void EccPoint_double_jacobian(uECC_word_t * RESTRICT X1,
                                     uECC_word_t * RESTRICT Y1,
                                     uECC_word_t * RESTRICT Z1) {
    /* t1 = X, t2 = Y, t3 = Z */
    uECC_word_t t4[uECC_WORDS];
    uECC_word_t t5[uECC_WORDS];

    if (vli_isZero(Z1)) {
        return;
    }

    vli_modSquare_fast(t4, Y1);   /* t4 = y1^2 */
    vli_modMult_fast(t5, X1, t4); /* t5 = x1*y1^2 = A */
    vli_modSquare_fast(t4, t4);   /* t4 = y1^4 */
    vli_modMult_fast(Y1, Y1, Z1); /* t2 = y1*z1 = z3 */
    vli_modSquare_fast(Z1, Z1);   /* t3 = z1^2 */

    vli_modAdd(X1, X1, Z1, curve_p); /* t1 = x1 + z1^2 */
    vli_modAdd(Z1, Z1, Z1, curve_p); /* t3 = 2*z1^2 */
    vli_modSub_fast(Z1, X1, Z1);     /* t3 = x1 - z1^2 */
    vli_modMult_fast(X1, X1, Z1);    /* t1 = x1^2 - z1^4 */

    vli_modAdd(Z1, X1, X1, curve_p); /* t3 = 2*(x1^2 - z1^4) */
    vli_modAdd(X1, X1, Z1, curve_p); /* t1 = 3*(x1^2 - z1^4) */
    if (vli_testBit(X1, 0)) {
        uECC_word_t l_carry = vli_add(X1, X1, curve_p);
        vli_rshift1(X1);
        X1[uECC_WORDS - 1] |= l_carry << (uECC_WORD_BITS - 1);
    } else {
        vli_rshift1(X1);
    }
    /* t1 = 3/2*(x1^2 - z1^4) = B */

    vli_modSquare_fast(Z1, X1);   /* t3 = B^2 */
    vli_modSub_fast(Z1, Z1, t5);  /* t3 = B^2 - A */
    vli_modSub_fast(Z1, Z1, t5);  /* t3 = B^2 - 2A = x3 */
    vli_modSub_fast(t5, t5, Z1);  /* t5 = A - x3 */
    vli_modMult_fast(X1, X1, t5); /* t1 = B * (A - x3) */
    vli_modSub_fast(t4, X1, t4);  /* t4 = B * (A - x3) - y1^4 = y3 */

    vli_set(X1, Z1);
    vli_set(Z1, Y1);
    vli_set(Y1, t4);
}